

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

bool __thiscall cs222::Parser::parseMemory(Parser *this,string *token,Operand *operand)

{
  bool bVar1;
  char *pcVar2;
  long lVar3;
  Type local_134;
  Operand local_130;
  allocator local_101;
  string local_100;
  Type local_dc;
  Operand local_d8;
  int local_ac;
  undefined1 local_a8 [8];
  string indexedX;
  string location;
  size_t commaPosition;
  string local_50;
  char local_29;
  Operand *pOStack_28;
  char prefix;
  Operand *operand_local;
  string *token_local;
  Parser *this_local;
  
  pOStack_28 = operand;
  operand_local = (Operand *)token;
  token_local = (string *)this;
  bVar1 = parseLocation(this,token,operand);
  if (bVar1) {
    this_local._7_1_ = 1;
  }
  else {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)operand_local);
    local_29 = *pcVar2;
    if ((local_29 == '@') || (local_29 == '#')) {
      std::__cxx11::string::substr((ulong)&local_50,(ulong)operand_local);
      bVar1 = parseLocation(this,&local_50,pOStack_28);
      std::__cxx11::string::~string((string *)&local_50);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        if (local_29 == '#') {
          std::bitset<6UL>::set(&this->flags,4,true);
        }
        else if (local_29 == '@') {
          std::bitset<6UL>::set(&this->flags,5,true);
        }
        this_local._7_1_ = 1;
      }
      else {
        this_local._7_1_ = 0;
      }
    }
    else {
      lVar3 = std::__cxx11::string::find((char)operand_local,0x2c);
      if (lVar3 != -1) {
        std::__cxx11::string::substr((ulong)((long)&indexedX.field_2 + 8),(ulong)operand_local);
        std::__cxx11::string::substr((ulong)local_a8,(ulong)operand_local);
        bVar1 = parseLocation(this,(string *)((long)&indexedX.field_2 + 8),pOStack_28);
        if ((bVar1) &&
           (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_a8,"X"), bVar1)) {
          std::bitset<6UL>::set(&this->flags,3,true);
          this_local._7_1_ = 1;
          local_ac = 1;
        }
        else {
          local_ac = 0;
        }
        std::__cxx11::string::~string((string *)local_a8);
        std::__cxx11::string::~string((string *)(indexedX.field_2._M_local_buf + 8));
        if (local_ac != 0) goto LAB_001348e8;
      }
      bVar1 = parseLiteral(this,(string *)operand_local,pOStack_28);
      if ((bVar1) || (bVar1 = parseConstant(this,(string *)operand_local,pOStack_28), bVar1)) {
        this_local._7_1_ = 1;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )operand_local,"*");
        if (bVar1) {
          local_dc = LOCCTR;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_100,"",&local_101);
          Operand::Operand(&local_d8,&local_dc,&local_100);
          Operand::operator=(pOStack_28,&local_d8);
          Operand::~Operand(&local_d8);
          std::__cxx11::string::~string((string *)&local_100);
          std::allocator<char>::~allocator((allocator<char> *)&local_101);
          this_local._7_1_ = 1;
        }
        else {
          bVar1 = parseExpression(this,(string *)operand_local);
          if (bVar1) {
            local_134 = EXPRESSION;
            Operand::Operand(&local_130,&local_134,(string *)operand_local);
            Operand::operator=(pOStack_28,&local_130);
            Operand::~Operand(&local_130);
            this_local._7_1_ = 1;
          }
          else {
            this_local._7_1_ = 0;
          }
        }
      }
    }
  }
LAB_001348e8:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Parser::parseMemory(const std::string& token, Operand& operand)
    {
        if (parseLocation(token, operand))
        {
            return true;
        }

        const char prefix = token[0];
        if (prefix == '@' || prefix == '#')
        {
            if (!parseLocation(token.substr(1), operand))
            {
                return false;
            }
            switch (prefix)
            {
                case '@':
                    flags.set(Instruction::FLAG_INDIRECT);
                    break;
                case '#':
                    flags.set(Instruction::FLAG_IMMEDIATE);
                    break;
            }
            return true;
        }

        size_t commaPosition = token.find(',');
        if (commaPosition != std::string::npos)
        {
            std::string location = token.substr(0, commaPosition);
            std::string indexedX = token.substr(commaPosition + 1);
            if (parseLocation(location, operand) && indexedX == "X")
            {
                flags.set(Instruction::FLAG_INDEXED);
                return true;
            }
        }

        if (parseLiteral(token, operand) || parseConstant(token, operand))
        {
            return true;
        }

        if (token == "*")
        {
            operand = Operand(Operand::LOCCTR);
            return true;
        }

        if (parseExpression(token))
        {
            operand = Operand(Operand::EXPRESSION, token);
            return true;
        }

        return false;
    }